

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix.cpp
# Opt level: O2

void Timidity::mix_single_signal
               (SDWORD control_ratio,sample_t *sp,float *lp,Voice *v,float *ampat,int count)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = v->control_counter;
  if (v->control_counter != 0) goto LAB_00349f0e;
  while( true ) {
    iVar3 = update_signal(v);
    iVar4 = control_ratio;
    if (iVar3 != 0) {
      return;
    }
LAB_00349f0e:
    if (count == 0) break;
    fVar1 = *ampat;
    iVar3 = iVar4;
    if (count <= iVar4) {
      v->control_counter = iVar4 - count;
      for (lVar5 = 0; count != (int)lVar5; lVar5 = lVar5 + 1) {
        lp[lVar5 * 2] = sp[lVar5] * fVar1 + lp[lVar5 * 2];
      }
      return;
    }
    while (iVar3 != 0) {
      fVar2 = *sp;
      sp = sp + 1;
      *lp = fVar2 * fVar1 + *lp;
      lp = lp + 2;
      iVar3 = iVar3 + -1;
    }
    count = count - iVar4;
  }
  return;
}

Assistant:

static void mix_single_signal(SDWORD control_ratio, const sample_t *sp, float *lp, Voice *v, float *ampat, int count)
{
	final_volume_t amp;
	int cc;

	if (0 == (cc = v->control_counter))
	{
		cc = control_ratio;
		if (update_signal(v))
			return;		/* Envelope ran out */
	}
	amp = *ampat;

	while (count)
	{
		if (cc < count)
		{
			count -= cc;
			while (cc--)
			{
				lp[0] += *sp++ * amp;
				lp += 2;
			}
			cc = control_ratio;
			if (update_signal(v))
				return;	/* Envelope ran out */
			amp = *ampat;
		}
		else
		{
			v->control_counter = cc - count;
			while (count--)
			{
				lp[0] += *sp++ * amp;
				lp += 2;
			}
			return;
		}
	}
}